

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereIndexedExprCleanup(sqlite3 *db,void *pObject)

{
  sqlite3 *db_00;
  sqlite3 *in_RSI;
  IndexedExpr *p;
  IndexedExpr **pp;
  Expr *in_stack_ffffffffffffffd8;
  sqlite3 *db_01;
  
  db_01 = in_RSI;
  while (in_RSI->pVfs != (sqlite3_vfs *)0x0) {
    db_00 = (sqlite3 *)in_RSI->pVfs;
    in_RSI->pVfs = (sqlite3_vfs *)db_00->mutex;
    sqlite3ExprDelete(db_00,in_stack_ffffffffffffffd8);
    sqlite3DbFreeNN(db_01,in_RSI);
  }
  return;
}

Assistant:

static void whereIndexedExprCleanup(sqlite3 *db, void *pObject){
  IndexedExpr **pp = (IndexedExpr**)pObject;
  while( *pp!=0 ){
    IndexedExpr *p = *pp;
    *pp = p->pIENext;
    sqlite3ExprDelete(db, p->pExpr);
    sqlite3DbFreeNN(db, p);
  }
}